

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::setDepthMask(COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
               *this,bool enable)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  
  bVar1 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 0xa0) & 1) != bVar1) {
    if (bVar1 == 0) {
      (*GL.DepthMask)('\0');
    }
    else {
      (*GL.DepthMask)('\x01');
    }
    *(byte *)(in_RDI + 0xa0) = bVar1;
  }
  return;
}

Assistant:

void setDepthMask(bool enable)
	{
		if (DepthMask != enable) {
			if (enable)
				GL.DepthMask(GL_TRUE);
			else
				GL.DepthMask(GL_FALSE);

			DepthMask = enable;
		}
	}